

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_3_channels_with_1_coeff
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float fVar1;
  undefined8 uVar2;
  __m128 d;
  __m128 c;
  __m128 tot;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_108;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float local_78;
  float fStack_74;
  float fStack_70;
  
  decode = output_buffer;
  pfStack_108 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    fVar1 = *pfStack_108;
    uVar2 = *(undefined8 *)(decode_buffer + (int)*horizontal_coefficients_local * 3);
    local_78 = (float)uVar2;
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    fStack_70 = (float)*(undefined8 *)(decode_buffer + (int)*horizontal_coefficients_local * 3 + 2);
    c[3] = fStack_74 * fVar1;
    c[2] = local_78 * fVar1;
    *(undefined8 *)decode = c._8_8_;
    decode[2] = fStack_70 * fVar1;
    pfStack_108 = pfStack_108 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 3;
  } while (decode < output_buffer + output_sub_size * 3);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_1_coeff)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__1_coeff_only();
    stbir__store_output_tiny();
  } while ( output < output_end );
}